

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixfork.c
# Opt level: O1

int fork_Unix(void)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  __pid_t _Var5;
  int extraout_EAX;
  uint extraout_EAX_00;
  time_t tVar6;
  ssize_t sVar7;
  int *piVar8;
  ushort *__buf;
  char *pcVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  char *__s1;
  char *pcVar13;
  uint __status;
  unsigned_short tmp;
  char IOBuf [6];
  int UnixToLisp [2];
  int LispToUnix [2];
  char slavepty [32];
  char tempstring [30];
  termios tio;
  sigset_t signals;
  ushort local_1c4;
  undefined2 local_1c2;
  char local_1c0;
  byte local_1bf;
  undefined1 local_1be;
  undefined1 local_1bd;
  int local_1bc;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  uint local_1ac;
  char local_1a8 [32];
  sockaddr local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined6 uStack_130;
  undefined2 uStack_12a;
  undefined6 uStack_128;
  undefined8 uStack_122;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  termios local_f8;
  sigset_t local_b0;
  
  local_1c4 = 0;
  iVar3 = pipe(&local_1b0);
  if (iVar3 == -1) {
    fork_Unix_cold_17();
  }
  else {
    iVar3 = pipe((int *)&local_1b8);
    if (iVar3 != -1) {
      tVar6 = time((time_t *)0x0);
      StartTime = (long)((uint)tVar6 & 0xffffff);
      sigemptyset(&local_b0);
      sigaddset(&local_b0,0x1a);
      sigaddset(&local_b0,0x1d);
      sigaddset(&local_b0,0xe);
      sigaddset(&local_b0,0x19);
      sigaddset(&local_b0,8);
      sigprocmask(0,&local_b0,(sigset_t *)0x0);
      uVar4 = fork();
      if (uVar4 != 0) {
        if (uVar4 != 0xffffffff) {
          snprintf((char *)&local_188,0x1e,"%d",(ulong)local_1b8);
          setenv("LDEPIPEIN",(char *)&local_188,1);
          snprintf((char *)&local_188,0x1e,"%d",(ulong)local_1ac);
          setenv("LDEPIPEOUT",(char *)&local_188,1);
          snprintf((char *)&local_188,0x1e,"%ld",StartTime);
          setenv("LDESTARTTIME",(char *)&local_188,1);
          snprintf((char *)&local_188,0x1e,"%d",(ulong)uVar4);
          setenv("LDEUNIXPID",(char *)&local_188,1);
          close(local_1b0);
          close(local_1b4);
          return 1;
        }
        fork_Unix_cold_15();
LAB_00102ece:
        exit(0);
      }
      goto LAB_00102952;
    }
  }
  fork_Unix_cold_16();
LAB_00102952:
  close(local_1ac);
  close(local_1b8);
  uVar4 = fcntl(local_1b0,3,0);
  fcntl(local_1b0,4,(ulong)(uVar4 & 0xfffff7ff));
  local_1bc = local_1b4;
  iVar3 = local_1b4;
  do {
    sVar7 = read(local_1b0,&local_1c2,6);
    if (sVar7 < 0) {
      piVar8 = __errno_location();
      do {
        if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
          perror("reading UnixPipeIn");
          break;
        }
        sVar7 = read(local_1b0,&local_1c2,6);
      } while (sVar7 < 0);
    }
    bVar2 = local_1bf;
    if (sVar7 == 0) goto LAB_00102ece;
    if (sVar7 < 0) {
      fork_Unix_cold_14();
LAB_00102eda:
      exit(1);
    }
    if (sVar7 != 6) goto LAB_00102eda;
    __buf = (ushort *)(ulong)local_1bf;
    local_1bf = 1;
    bVar1 = (byte)local_1c2;
    if ((byte)local_1c2 < 0x53) {
      if ((byte)local_1c2 == 0x46) {
        if ((char)bVar2 < '\0') {
          puts("No process slots available.");
          goto LAB_00102e25;
        }
        sVar7 = read(local_1b0,&local_1c4,2);
        if (sVar7 < 0) {
          piVar8 = __errno_location();
          do {
            if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
              fork_Unix_cold_1();
              break;
            }
            sVar7 = read(local_1b0,&local_1c4,2);
          } while (sVar7 < 0);
        }
        uVar12 = (ulong)local_1c4;
        pcVar13 = shcom;
        if (0x1fe < uVar12) {
          pcVar13 = (char *)malloc(uVar12 + 5);
        }
        sVar7 = read(local_1b0,pcVar13,uVar12);
        if (sVar7 < 0) {
          piVar8 = __errno_location();
          do {
            if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
              fork_Unix_cold_2();
              break;
            }
            sVar7 = read(local_1b0,pcVar13,uVar12);
          } while (sVar7 < 0);
        }
        _Var5 = fork();
        if (_Var5 == -1) {
          perror("unixcomm: fork");
          local_1bf = 0;
          iVar3 = local_1bc;
        }
        else {
          if (_Var5 == 0) goto LAB_00102fea;
          local_1c2 = CONCAT11((char)((uint)_Var5 >> 8),(byte)local_1c2);
          local_1be = (undefined1)((uint)_Var5 >> 0x10);
          local_1bd = (undefined1)((uint)_Var5 >> 0x18);
          iVar3 = local_1bc;
          local_1c0 = (char)_Var5;
        }
      }
      else if ((byte)local_1c2 == 0x50) {
LAB_00102a3e:
        if ((char)bVar2 < '\0') {
          pcVar13 = "Can\'t get process slot for PTY shell.";
        }
        else {
          __buf = &local_1c4;
          sVar7 = read(local_1b0,__buf,2);
          if (sVar7 < 0) {
            piVar8 = __errno_location();
            do {
              if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
                fork_Unix_cold_5();
                break;
              }
              sVar7 = read(local_1b0,__buf,2);
            } while (sVar7 < 0);
          }
          uVar12 = (ulong)local_1c4;
          sVar7 = read(local_1b0,local_1a8,uVar12);
          if (sVar7 < 0) {
            __buf = (ushort *)__errno_location();
            do {
              if ((*(int *)__buf != 0xb) && (*(int *)__buf != 4)) {
                fork_Unix_cold_6();
                break;
              }
              sVar7 = read(local_1b0,local_1a8,uVar12);
            } while (sVar7 < 0);
          }
          if (bVar1 == 0x50) {
            sVar7 = read(local_1b0,&local_1c4,2);
            if (sVar7 < 0) {
              piVar8 = __errno_location();
              do {
                if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
                  fork_Unix_cold_7();
                  break;
                }
                sVar7 = read(local_1b0,&local_1c4,2);
              } while (sVar7 < 0);
            }
            uVar12 = (ulong)local_1c4;
            if (0x3f < uVar12) {
              perror("Slave termtype length too long");
            }
            sVar7 = read(local_1b0,&local_188,uVar12);
            if (sVar7 < 0) {
              piVar8 = __errno_location();
              do {
                if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
                  fork_Unix_cold_8();
                  break;
                }
                sVar7 = read(local_1b0,&local_188,uVar12);
              } while (sVar7 < 0);
            }
            local_188.sa_data[uVar12 - 2] = '\0';
            sVar7 = read(local_1b0,&local_1c4,2);
            if (sVar7 < 0) {
              piVar8 = __errno_location();
              do {
                if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
                  fork_Unix_cold_9();
                  break;
                }
                sVar7 = read(local_1b0,&local_1c4,2);
              } while (sVar7 < 0);
            }
            __buf = (ushort *)(ulong)local_1c4;
            pcVar13 = shcom;
            if ((ushort *)0x1fe < __buf) {
              pcVar13 = (char *)malloc((long)__buf + 5);
            }
            sVar7 = read(local_1b0,pcVar13,(size_t)__buf);
            if (sVar7 < 0) {
              piVar8 = __errno_location();
              do {
                if ((*piVar8 != 0xb) && (*piVar8 != 4)) {
                  fork_Unix_cold_10();
                  break;
                }
                sVar7 = read(local_1b0,pcVar13,(size_t)__buf);
              } while (sVar7 < 0);
            }
          }
          else {
            local_188._0_8_ = local_188._0_8_ & 0xffffffffffffff00;
            shcom[0] = '\0';
            pcVar13 = shcom;
          }
          local_108 = 0;
          uStack_100 = 0;
          local_118 = 0;
          uStack_110 = 0;
          _Var5 = fork();
          if (_Var5 == 0) {
            _Var5 = setsid();
            if (_Var5 < 0) {
              perror("setsid");
            }
            iVar3 = open(local_1a8,2);
            if (iVar3 == -1) {
              fork_Unix_cold_13();
              iVar3 = extraout_EAX;
            }
            tcgetattr(iVar3,&local_f8);
            local_f8.c_lflag = local_f8.c_lflag | 0xa1a;
            tcsetattr(iVar3,0,&local_f8);
            dup2(iVar3,0);
            dup2(iVar3,1);
            dup2(iVar3,2);
            close(iVar3);
            setenv("LDESHELL","YES",1);
            if ((char)local_188.sa_family != '\0') {
              setenv("TERM",(char *)&local_188,1);
            }
            pcVar9 = getenv("SHELL");
            __s1 = "/bin/sh";
            if (pcVar9 != (char *)0x0) {
              __s1 = pcVar9;
            }
            pcVar9 = getusershell();
            break;
          }
          if (pcVar13 != shcom) {
            free(pcVar13);
          }
          if (_Var5 != -1) {
            local_1c2 = CONCAT11((char)((uint)_Var5 >> 8),(byte)local_1c2);
            local_1be = (undefined1)((uint)_Var5 >> 0x10);
            local_1bd = (undefined1)((uint)_Var5 >> 0x18);
            local_1c0 = (char)_Var5;
            goto LAB_00102e2a;
          }
          pcVar13 = "Impossible failure from ForkUnixShell??";
        }
        puts(pcVar13);
        fflush(_stdout);
LAB_00102e25:
        local_1bf = 0;
      }
    }
    else if ((byte)local_1c2 == 0x57) {
      local_188._0_8_ = local_188._0_8_ & 0xffffffff00000000;
      local_1c2 = 0;
      do {
        _Var5 = waitpid(-1,(int *)&local_188,1);
        if (_Var5 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      if ((0 < _Var5) && ((char)local_188.sa_family != '\x7f')) {
        local_1bd = (undefined1)((uint)_Var5 >> 0x18);
        local_1be = (undefined1)((uint)_Var5 >> 0x10);
        local_1bf = local_188.sa_family._1_1_;
        local_1c2 = CONCAT11((char)_Var5,(char)((uint)_Var5 >> 8));
        local_1c0 = (char)local_188.sa_family;
      }
    }
    else if ((byte)local_1c2 == 0x53) goto LAB_00102a3e;
LAB_00102e2a:
    write(iVar3,&local_1c2,6);
  } while( true );
joined_r0x00102fc0:
  if (pcVar9 == (char *)0x0) {
    fork_Unix_cold_12();
LAB_00102fea:
    uVar4 = socket(1,1,0);
    if ((int)uVar4 < 0) {
      fork_Unix_cold_4();
      uVar4 = extraout_EAX_00;
    }
    __s1 = (char *)(ulong)uVar4;
    snprintf((char *)&local_f8,0x28,"/tmp/LPU%ld-%d",StartTime,(ulong)__buf & 0xffffffff);
    local_188.sa_data[6] = '\0';
    local_188.sa_data[7] = '\0';
    local_188.sa_data[8] = '\0';
    local_188.sa_data[9] = '\0';
    local_188.sa_data[10] = '\0';
    local_188.sa_data[0xb] = '\0';
    local_188.sa_data[0xc] = '\0';
    local_188.sa_data[0xd] = '\0';
    local_178 = 0;
    uStack_170 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_138 = 0;
    uStack_130 = 0;
    uStack_12a = 0;
    uStack_128 = 0;
    uStack_122 = 0;
    local_188.sa_family = 1;
    local_188.sa_data[0] = '\0';
    local_188.sa_data[1] = '\0';
    local_188.sa_data[2] = '\0';
    local_188.sa_data[3] = '\0';
    local_188.sa_data[4] = '\0';
    local_188.sa_data[5] = '\0';
    strcpy(local_188.sa_data,(char *)&local_f8);
    iVar3 = connect(uVar4,&local_188,0x6e);
    if (iVar3 < 0) {
      fork_Unix_cold_3();
LAB_00103082:
      uVar4 = (uint)__s1;
      fork_Unix_cold_11();
    }
    dup2(uVar4,0);
    dup2(uVar4,1);
    dup2(uVar4,2);
    lVar10 = sysconf(4);
    if (3 < lVar10) {
      lVar10 = 3;
      do {
        close((int)lVar10);
        lVar10 = lVar10 + 1;
        lVar11 = sysconf(4);
      } while (lVar10 < lVar11);
    }
    uVar4 = system(pcVar13);
    if (pcVar13 != shcom) {
      free(pcVar13);
    }
    __status = (int)uVar4 >> 8;
    if (uVar4 < 0x100) {
      __status = uVar4;
    }
    _exit(__status);
  }
  iVar3 = strcmp(__s1,pcVar9);
  if (iVar3 == 0) goto LAB_00103082;
  pcVar9 = getusershell();
  goto joined_r0x00102fc0;
}

Assistant:

int fork_Unix(void) {
  int LispToUnix[2], /* Incoming pipe from LISP */
      UnixToLisp[2], /* Outgoing pipe to LISP */
      UnixPID, LispPipeIn, LispPipeOut, slot;
  pid_t pid;
  sigset_t signals;

  char IOBuf[6]; /* XXX: signed, because slot comes from here */
  unsigned short tmp = 0;
  char *cmdstring;

  /* Pipes between LISP subr and process */
  if (pipe(LispToUnix) == -1) {
    perror("pipe");
    exit(-1);
  }
  if (pipe(UnixToLisp) == -1) {
    perror("pipe");
    exit(-1);
  }

  StartTime = time(0);   /* Save the time, to create filenames with */
  StartTime &= 0xFFFFFF; /* as a positive number! */

  /* interrupts need to be blocked here so subprocess won't see them */
  sigemptyset(&signals);
  sigaddset(&signals, SIGVTALRM);
#ifndef MAIKO_OS_HAIKU
  sigaddset(&signals, SIGIO);
#endif
  sigaddset(&signals, SIGALRM);
  sigaddset(&signals, SIGXFSZ);
  sigaddset(&signals, SIGFPE);
  sigprocmask(SIG_BLOCK, &signals, NULL);

  if ((UnixPID = fork()) == -1) { /* Fork off small version of the emulator */
    perror("fork");
    exit(-1);
  }

  if (UnixPID != 0) {
    /* JRB - fork_Unix is now called in ldeboot; leave UnixPipe{In,Out} open
       and put their numbers in the environment so parent can find them */
    /* JDS - NB that sprintf doesn't always return a string! */
    /* NHB - if the return value of snprintf() is greater than or equal to the
     * size argument, the string was too short and some of the printed
     * characters were discarded. However we're printing numbers, so we know
     * that the buffer is big enough
     */
    char tempstring[30];

    (void)snprintf(tempstring, sizeof(tempstring), "%d", UnixToLisp[0]);
    setenv("LDEPIPEIN", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%d", LispToUnix[1]);
    setenv("LDEPIPEOUT", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%ld", StartTime);
    setenv("LDESTARTTIME", tempstring, 1);

    (void)snprintf(tempstring, sizeof(tempstring), "%d", UnixPID);
    setenv("LDEUNIXPID", tempstring, 1);

    close(LispToUnix[0]);
    close(UnixToLisp[1]);
    return (1);
  }

  LispPipeIn = LispToUnix[0];
  LispPipeOut = UnixToLisp[1];
  close(LispToUnix[1]);
  close(UnixToLisp[0]);

  fcntl(LispPipeIn, F_SETFL, fcntl(LispPipeIn, F_GETFL, 0) & ~O_NONBLOCK);

  while (1) {
    ssize_t len;
    len = SAFEREAD(LispPipeIn, IOBuf, 6);
    if (len == 0)
      exit(0);
    if (len < 0) {
      perror("Error reading packet by slave");
      exit(1);
    } else if (len != 6) {
      DBPRINT(("Input packet wrong length: %zd", len));
      exit(1);
    }
    slot = (int)IOBuf[3];
    IOBuf[3] = 1; /* Start by signalling success in return-code */

    switch (IOBuf[0]) {
      case 'S':
      case 'P':          /* Fork PTY shell */
        if (slot >= 0) { /* Found a free slot */
          char termtype[64];
          char slavepty[32]; /* For slave pty name */

          if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading slave pty len");
          if (SAFEREAD(LispPipeIn, slavepty, tmp) < 0) perror("Slave reading slave pty id");

          if (IOBuf[0] == 'P') { /* The new style, which takes term type & command to csh */
            if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
            if (tmp > 63) perror("Slave termtype length too long");
            if (SAFEREAD(LispPipeIn, termtype, tmp) < 0) perror("Slave reading termtype");
            termtype[tmp] = '\0';
            if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
            if (tmp > 510)
              cmdstring = (char *)malloc(tmp + 5);
            else
              cmdstring = shcom;

            if (SAFEREAD(LispPipeIn, cmdstring, tmp) < 0) perror("Slave reading shcom");
          } else /* old style, no args */
          {
            termtype[0] = 0;
            cmdstring = shcom;
            cmdstring[0] = 0;
          }

          /* Alloc a PTY and fork  */
          pid = ForkUnixShell(slot, slavepty, termtype, cmdstring);

          if (pid == -1) {
            printf("Impossible failure from ForkUnixShell??\n");
            fflush(stdout);
            IOBuf[3] = 0;
          } else {
            /* ForkUnixShell sets the pid and standard in/out variables */
            IOBuf[1] = (pid >> 8) & 0xFF;
            IOBuf[2] = pid & 0xFF;
            IOBuf[4] = (pid >> 16) & 0xFF;
            IOBuf[5] = (pid >> 24) & 0xFF;
          }
        } else {
          printf("Can't get process slot for PTY shell.\n");
          fflush(stdout);
          IOBuf[3] = 0;
        }
        break;

      case 'F': /* Fork pipe command */
        if (slot >= 0) {
          /* Read in the length of the shell command, and then the command */
          if (SAFEREAD(LispPipeIn, (char *)&tmp, 2) < 0) perror("Slave reading cmd length");
          if (tmp > 510)
            cmdstring = (char *)malloc(tmp + 5);
          else
            cmdstring = shcom;
          if (SAFEREAD(LispPipeIn, cmdstring, tmp) < 0) perror("Slave reading cmd");
          DBPRINT(("Cmd len = %d.\n", tmp));
          DBPRINT(("Rev'd cmd string: %s\n", cmdstring));
          pid = fork(); /* Fork */

          if (pid == 0) {
            int i;
            int status, sock;
            struct sockaddr_un addr;
            char PipeName[40];
            sock = socket(AF_UNIX, SOCK_STREAM, 0);
            if (sock < 0) {
              perror("slave socket");
              exit(1);
            }
            (void)snprintf(PipeName, sizeof(PipeName), "/tmp/LPU%ld-%d", StartTime, slot);
            memset(&addr, 0, sizeof(struct sockaddr_un));
            addr.sun_family = AF_UNIX;
            strcpy(addr.sun_path, PipeName);
            status =
                connect(sock, (struct sockaddr *)&addr, sizeof(struct sockaddr_un));
            if (status < 0) {
              perror("slave connect");
              printf("Name = %s.\n", PipeName);
              fflush(stdout);
              exit(1);
            } else {
              DBPRINT(("Slave connected on %s.\n", PipeName));
            }

            /* Copy the pipes onto stdin, stdout, and stderr */
            dup2(sock, 0);
            dup2(sock, 1);
            dup2(sock, 2);

            /* Make sure everything else is closed. */
            for (i = 3; i < sysconf(_SC_OPEN_MAX); i++) close(i);

            /* Run the shell command and get the result */
            status = system(cmdstring);
            if (cmdstring != shcom) free(cmdstring);
            /* Comment out to fix USAR 11302 (FXAR 320)
            unlink(PipeName);
            */
            _exit((status & ~0xff) ? (status >> 8) : status);
          }

          /* Check for error doing the fork */
          if (pid == (pid_t)-1) {
            perror("unixcomm: fork");
            IOBuf[3] = 0;
          } else {
            IOBuf[1] = (pid >> 8) & 0xFF;
            IOBuf[2] = pid & 0xFF;
            IOBuf[4] = (pid >> 16) & 0xFF;
            IOBuf[5] = (pid >> 24) & 0xFF;
          }
        } else {
          printf("No process slots available.\n");
          IOBuf[3] = 0; /* Couldn't get a process slot */
        }
        break;

      case 'W': /* Wait for a process to die. */
      {
        int status;

        status = 0;

        IOBuf[0] = 0;
        IOBuf[1] = 0;
        DBPRINT(("About to wait for processes.\n"));
      retry1:
        pid = waitpid(-1, &status, WNOHANG);
        if (pid == -1 && errno == EINTR) goto retry1;
        if (pid > 0) {
          /* Ignore processes which are suspended but haven't exited
             (this shouldn't happen) */
          if (WIFSTOPPED(status)) break;
          IOBuf[5] = (pid >> 24) & 0xFF;
          IOBuf[4] = (pid >> 16) & 0xFF;
          IOBuf[3] = status >> 8;
          IOBuf[2] = status & 0xFF;
          IOBuf[1] = pid & 0xFF;
          IOBuf[0] = (pid >> 8) & 0xFF;
        }
        DBPRINT(("wait3 returned pid = %ld.\n", (long)pid));
      }

      break;

      case 'C': /* Close stdin to subprocess */ break;

      case 'K': /* Kill subprocess */ break;
    } /* End of switch */

    /* Return the status/data packet */
    write(LispPipeOut, IOBuf, 6);
  }
}